

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void close_socket(cio_socket *socket)

{
  cio_event_notifier *evn;
  
  evn = &(socket->impl).ev;
  cio_linux_eventloop_unregister_read((socket->impl).loop,evn);
  cio_linux_eventloop_remove((socket->impl).loop,evn);
  cio_timer_close(&(socket->impl).close_timer);
  close((socket->impl).ev.fd);
  if (socket->close_hook != (cio_socket_close_hook_t)0x0) {
    (*socket->close_hook)(socket);
    return;
  }
  return;
}

Assistant:

static void close_socket(struct cio_socket *socket)
{
	cio_linux_eventloop_unregister_read(socket->impl.loop, &socket->impl.ev);
	cio_linux_eventloop_remove(socket->impl.loop, &socket->impl.ev);

	cio_timer_close(&socket->impl.close_timer);
	close_and_call_hook(socket);
}